

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * __thiscall
testing::internal::String::FormatByte_abi_cxx11_
          (string *__return_storage_ptr__,String *this,uchar value)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *pvVar4;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [383];
  byte local_11;
  string *psStack_10;
  uchar value_local;
  
  local_11 = (byte)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(local_190,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::uppercase);
  std::ostream::operator<<(pvVar4,(uint)local_11);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatByte(unsigned char value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << std::hex << std::uppercase
     << static_cast<unsigned int>(value);
  return ss.str();
}